

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O3

Elf_Half __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::get_section_name_str_index
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = (this->header).e_shstrndx;
  uVar2 = uVar1 << 8 | uVar1 >> 8;
  if ((this->convertor).need_conversion == false) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

uint16_t
    operator()( uint16_t value ) const
    {
        if ( !need_conversion ) {
            return value;
        }
        value =
            ( ( value & 0x00FF ) <<  8 ) |
            ( ( value & 0xFF00 ) >>  8 );

        return value;
    }